

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O3

void __thiscall boost::deflate::error_test::check(error_test *this,char *name,error ev)

{
  long *plVar1;
  error eVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  error_category *peVar5;
  error_category *peVar6;
  error_code eVar7;
  error_code ec;
  allocator<char> local_65;
  error local_64;
  long *local_60;
  long local_58;
  long local_50 [2];
  error_code local_40;
  
  local_40 = make_error_code(ev);
  peVar5 = local_40.cat_;
  uVar4 = local_40._0_8_;
  eVar7 = make_error_code(0);
  plVar1 = test_suite::detail::current()::p;
  peVar6 = eVar7.cat_;
  iVar3 = (**peVar5->_vptr_error_category)(peVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,(char *)CONCAT44(extraout_var,iVar3),&local_65);
  local_64 = ev;
  iVar3 = std::__cxx11::string::compare((char *)&local_60);
  (**(code **)(*plVar1 + 0x28 + (ulong)(iVar3 != 0) * 8))
            (plVar1,"std::string{ec.category().name()} == name",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1b,"void boost::deflate::error_test::check(const char *, error)");
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  plVar1 = test_suite::detail::current()::p;
  (*peVar5->_vptr_error_category[4])(&local_60,peVar5,uVar4 & 0xffffffff);
  (**(code **)(*plVar1 + 0x28 + (ulong)(local_58 == 0) * 8))
            (plVar1,"! ec.message().empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1c,"void boost::deflate::error_test::check(const char *, error)");
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  peVar5 = local_40.cat_;
  (**(code **)(*test_suite::detail::current()::p + 0x28 + (ulong)(local_40.cat_ != peVar6) * 8))
            (test_suite::detail::current()::p,"std::addressof(ec.category()) == std::addressof(cat)"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1e,"void boost::deflate::error_test::check(const char *, error)");
  eVar2 = local_64;
  plVar1 = test_suite::detail::current()::p;
  iVar3 = (*peVar5->_vptr_error_category[1])(peVar5,(ulong)local_64);
  local_60 = (long *)CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*peVar6->_vptr_error_category[2])(peVar6,(ulong)eVar2,&local_60);
  (**(code **)(*plVar1 + 0x28 + (ulong)(byte)((byte)iVar3 ^ 1) * 8))
            (plVar1,
             "cat.equivalent( static_cast<std::underlying_type<error>::type>(ev), ec.category().default_error_condition( static_cast<std::underlying_type<error>::type>(ev)))"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x22,"void boost::deflate::error_test::check(const char *, error)");
  plVar1 = test_suite::detail::current()::p;
  iVar3 = (*peVar6->_vptr_error_category[3])(peVar6,&local_40,(ulong)eVar2);
  (**(code **)(*plVar1 + 0x28 + (ulong)(byte)((byte)iVar3 ^ 1) * 8))
            (plVar1,"cat.equivalent(ec, static_cast<std::underlying_type<error>::type>(ev))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x24,"void boost::deflate::error_test::check(const char *, error)");
  return;
}

Assistant:

void check(char const* name, error ev)
    {
        auto const ec = make_error_code(ev);
        auto const& cat = make_error_code(
            static_cast<deflate::error>(0)).category();
        BOOST_TEST(std::string{ec.category().name()} == name);
        BOOST_TEST(! ec.message().empty());
        BOOST_TEST(
            std::addressof(ec.category()) == std::addressof(cat));
        BOOST_TEST(cat.equivalent(
            static_cast<std::underlying_type<error>::type>(ev),
                ec.category().default_error_condition(
                    static_cast<std::underlying_type<error>::type>(ev))));
        BOOST_TEST(cat.equivalent(ec,
            static_cast<std::underlying_type<error>::type>(ev)));
    }